

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.h
# Opt level: O3

void __thiscall llvm::DWARFDebugNames::ValueIterator::setEnd(ValueIterator *this)

{
  OptionalStorage<unsigned_int,_true> OVar1;
  undefined1 local_128 [16];
  undefined **local_118 [3];
  undefined1 local_100 [160];
  bool local_60;
  uint64_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40;
  undefined7 uStack_3f;
  anon_union_4_2_fc7899a5_for_OptionalStorage<unsigned_int,_true>_2 local_30;
  uint uStack_2c;
  
  memset(local_128,0,0x100);
  local_40 = 0;
  uStack_2c = uStack_2c & 0xffffff00;
  this->IsLocal = false;
  this->CurrentIndex = (NameIndex *)0x0;
  local_50[0] = &local_40;
  optional_detail::OptionalStorage<llvm::DWARFDebugNames::Entry,_false>::operator=
            (&(this->CurrentEntry).Storage,
             (OptionalStorage<llvm::DWARFDebugNames::Entry,_false> *)local_118);
  this->DataOffset = local_58;
  std::__cxx11::string::operator=((string *)&this->Key,(string *)local_50);
  OVar1._4_4_ = uStack_2c;
  OVar1.field_0.value = local_30.value;
  (this->Hash).Storage = OVar1;
  if (local_50[0] != &local_40) {
    operator_delete(local_50[0],CONCAT71(uStack_3f,local_40) + 1);
  }
  if (local_60 == true) {
    local_118[0] = &PTR___cxa_pure_virtual_01077f88;
    if (local_118[1] != (undefined **)local_100) {
      free(local_118[1]);
    }
  }
  return;
}

Assistant:

void setEnd() { *this = ValueIterator(); }